

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_tracker_connection.cpp
# Opt level: O0

void __thiscall libtorrent::aux::udp_tracker_connection::start(udp_tracker_connection *this)

{
  bool bVar1;
  int read_timeout;
  tracker_request *ptVar2;
  resolver_interface *prVar3;
  element_type *peVar4;
  undefined8 uVar5;
  error_code *in_R8;
  string_view url;
  int local_230;
  undefined1 local_1d8 [8];
  shared_ptr<libtorrent::aux::request_callback> cb;
  code *local_1b8;
  time_point local_1b0;
  function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
  local_180;
  undefined1 local_15f;
  bitfield_flag<unsigned_char,_libtorrent::aux::resolver_flag_tag,_void> local_15e [6];
  session_settings *psStack_158;
  int proxy_type;
  session_settings *settings;
  int local_148;
  seconds32 local_144;
  int local_140;
  seconds32 local_13c;
  tuple<std::__cxx11::string&,std::_Swallow_assign_const&,std::__cxx11::string&,int&,std::_Swallow_assign_const&>
  local_138 [56];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_100;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  undefined1 local_68 [8];
  error_code ec;
  undefined1 local_50 [4];
  int port;
  string protocol;
  string hostname;
  udp_tracker_connection *this_local;
  
  ::std::__cxx11::string::string((string *)(protocol.field_2._M_local_buf + 8));
  ::std::__cxx11::string::string((string *)local_50);
  boost::system::error_code::error_code((error_code *)local_68);
  ptVar2 = tracker_connection::tracker_req(&this->super_tracker_connection);
  local_100 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
               )::std::__cxx11::string::operator_cast_to_basic_string_view((string *)ptVar2);
  url._M_len = local_100._8_8_;
  url._M_str = local_68;
  parse_url_components_abi_cxx11_(&local_f0,(aux *)local_100._M_allocated_capacity,url,in_R8);
  ::std::
  tie<std::__cxx11::string,std::_Swallow_assign_const,std::__cxx11::string,int,std::_Swallow_assign_const>
            ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::_Swallow_assign_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int_&,_const_std::_Swallow_assign_&>
              *)local_138,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
             (_Swallow_assign *)&::std::ignore,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&protocol.field_2 + 8),(int *)((long)&ec.cat_ + 4),
             (_Swallow_assign *)&::std::ignore);
  ::std::
  tuple<std::__cxx11::string&,std::_Swallow_assign_const&,std::__cxx11::string&,int&,std::_Swallow_assign_const&>
  ::operator=(local_138,&local_f0);
  ::std::
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~tuple(&local_f0);
  if (ec.cat_._4_4_ == -1) {
    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_50,"http");
    ec.cat_._4_4_ = 0x1bb;
    if (bVar1) {
      ec.cat_._4_4_ = 0x50;
    }
  }
  bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)local_68);
  if (bVar1) {
    local_140 = 0;
    ::std::chrono::duration<int,std::ratio<1l,1l>>::duration<int,void>
              ((duration<int,std::ratio<1l,1l>> *)&local_13c,&local_140);
    local_148 = 0;
    ::std::chrono::duration<int,std::ratio<1l,1l>>::duration<int,void>
              ((duration<int,std::ratio<1l,1l>> *)&local_144,&local_148);
    tracker_connection::fail
              (&this->super_tracker_connection,(error_code *)local_68,parse_address,"",local_13c,
               local_144);
    settings._4_4_ = 1;
  }
  else {
    psStack_158 = tracker_manager::settings((this->super_tracker_connection).m_man);
    local_15e._2_4_ = session_settings::get_int(psStack_158,0x407b);
    bVar1 = session_settings::get_bool(psStack_158,0x8040);
    if ((bVar1) && ((local_15e._2_4_ == 2 || (local_15e._2_4_ == 3)))) {
      ::std::__cxx11::string::operator=
                ((string *)&this->m_hostname,(string *)(protocol.field_2._M_local_buf + 8));
      boost::asio::ip::basic_endpoint<boost::asio::ip::udp>::port(&this->m_target,ec.cat_._4_2_);
      start_announce(this);
    }
    else {
      prVar3 = tracker_manager::host_resolver((this->super_tracker_connection).m_man);
      ptVar2 = tracker_connection::tracker_req(&this->super_tracker_connection);
      if (ptVar2->event == stopped) {
        local_15e[0].m_val = '\x01';
      }
      else {
        libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::aux::resolver_flag_tag,_void>::
        bitfield_flag(local_15e);
      }
      local_15f = '\x02';
      local_15e[1] = libtorrent::flags::operator|
                               (local_15e[0],
                                (bitfield_flag<unsigned_char,_libtorrent::aux::resolver_flag_tag,_void>
                                 )0x2);
      local_1b8 = name_lookup;
      local_1b0.__d.__r = (duration)0;
      shared_from_this((udp_tracker_connection *)
                       &cb.
                        super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
      ::std::
      bind<void(libtorrent::aux::udp_tracker_connection::*)(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&,int),std::shared_ptr<libtorrent::aux::udp_tracker_connection>,std::_Placeholder<1>const&,std::_Placeholder<2>const&,int&>
                ((type *)&stack0xfffffffffffffe58,
                 (offset_in_udp_tracker_connection_to_subr *)&stack0xfffffffffffffe48,
                 (shared_ptr<libtorrent::aux::udp_tracker_connection> *)
                 &cb.
                  super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(_Placeholder<1> *)&::std::placeholders::_1,
                 (_Placeholder<2> *)&::std::placeholders::_2,(int *)((long)&ec.cat_ + 4));
      ::std::
      function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>
      ::
      function<std::_Bind<void(libtorrent::aux::udp_tracker_connection::*(std::shared_ptr<libtorrent::aux::udp_tracker_connection>,std::_Placeholder<1>,std::_Placeholder<2>,int))(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&,int)>,void>
                ((function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>
                  *)&local_180,
                 (_Bind<void_(libtorrent::aux::udp_tracker_connection::*(std::shared_ptr<libtorrent::aux::udp_tracker_connection>,_std::_Placeholder<1>,_std::_Placeholder<2>,_int))(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&,_int)>
                  *)&stack0xfffffffffffffe58);
      (**prVar3->_vptr_resolver_interface)
                (prVar3,(undefined1 *)((long)&protocol.field_2 + 8),(ulong)local_15e[1].m_val,
                 &local_180);
      ::std::
      function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
      ::~function(&local_180);
      ::std::
      _Bind<void_(libtorrent::aux::udp_tracker_connection::*(std::shared_ptr<libtorrent::aux::udp_tracker_connection>,_std::_Placeholder<1>,_std::_Placeholder<2>,_int))(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&,_int)>
      ::~_Bind((_Bind<void_(libtorrent::aux::udp_tracker_connection::*(std::shared_ptr<libtorrent::aux::udp_tracker_connection>,_std::_Placeholder<1>,_std::_Placeholder<2>,_int))(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&,_int)>
                *)&stack0xfffffffffffffe58);
      ::std::shared_ptr<libtorrent::aux::udp_tracker_connection>::~shared_ptr
                ((shared_ptr<libtorrent::aux::udp_tracker_connection> *)
                 &cb.
                  super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      tracker_connection::requester((tracker_connection *)local_1d8);
      bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_1d8);
      if (bVar1) {
        peVar4 = ::std::
                 __shared_ptr_access<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_1d8);
        uVar5 = ::std::__cxx11::string::c_str();
        (*peVar4->_vptr_request_callback[7])
                  (peVar4,"*** UDP_TRACKER [ initiating name lookup: \"%s\" ]",uVar5);
      }
      ::std::shared_ptr<libtorrent::aux::request_callback>::~shared_ptr
                ((shared_ptr<libtorrent::aux::request_callback> *)local_1d8);
    }
    ptVar2 = tracker_connection::tracker_req(&this->super_tracker_connection);
    if (ptVar2->event == stopped) {
      local_230 = session_settings::get_int(psStack_158,0x4002);
    }
    else {
      local_230 = session_settings::get_int(psStack_158,0x4000);
    }
    read_timeout = session_settings::get_int(psStack_158,0x4001);
    timeout_handler::set_timeout((timeout_handler *)this,local_230,read_timeout);
    settings._4_4_ = 0;
  }
  ::std::__cxx11::string::~string((string *)local_50);
  ::std::__cxx11::string::~string((string *)(protocol.field_2._M_local_buf + 8));
  return;
}

Assistant:

void udp_tracker_connection::start()
	{
		// TODO: 2 support authentication here. tracker_req().auth
		std::string hostname;
		std::string protocol;
		int port;
		error_code ec;

		std::tie(protocol, std::ignore, hostname, port, std::ignore)
			= parse_url_components(tracker_req().url, ec);
		if (port == -1) port = protocol == "http" ? 80 : 443;

		if (ec)
		{
			tracker_connection::fail(ec, operation_t::parse_address);
			return;
		}

		aux::session_settings const& settings = m_man.settings();

		int const proxy_type = settings.get_int(settings_pack::proxy_type);

		if (settings.get_bool(settings_pack::proxy_hostnames)
			&& (proxy_type == settings_pack::socks5
				|| proxy_type == settings_pack::socks5_pw))
		{
			m_hostname = hostname;
			m_target.port(std::uint16_t(port));
			start_announce();
		}
		else
		{
			using namespace std::placeholders;
			ADD_OUTSTANDING_ASYNC("udp_tracker_connection::name_lookup");
			// when stopping, pass in the cache-only flag, because we
			// don't want to get stuck on DNS lookups when shutting down
			m_man.host_resolver().async_resolve(hostname
				, (tracker_req().event == event_t::stopped
					? aux::resolver_interface::cache_only : aux::resolver_flags{})
					| aux::resolver_interface::abort_on_shutdown
				, std::bind(&udp_tracker_connection::name_lookup
					, shared_from_this(), _1, _2, port));

#ifndef TORRENT_DISABLE_LOGGING
			std::shared_ptr<request_callback> cb = requester();
			if (cb) cb->debug_log("*** UDP_TRACKER [ initiating name lookup: \"%s\" ]"
				, hostname.c_str());
#endif
		}

		set_timeout(tracker_req().event == event_t::stopped
			? settings.get_int(settings_pack::stop_tracker_timeout)
			: settings.get_int(settings_pack::tracker_completion_timeout)
			, settings.get_int(settings_pack::tracker_receive_timeout));
	}